

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BailOut.cpp
# Opt level: O0

Var BailOutRecord::BailOutCommon
              (JavascriptCallStackLayout *layout,BailOutRecord *bailOutRecord,uint32 bailOutOffset,
              void *returnAddress,BailOutKind bailOutKind,ImplicitCallFlags savedImplicitCallFlags,
              Var branchValue,BailOutReturnValue *bailOutReturnValue,void *argoutRestoreAddress)

{
  ScriptContext *this;
  ThreadContext *this_00;
  Var *src;
  Var pvVar1;
  ScriptFunction *function;
  Var result;
  Var registerSaves [49];
  ImplicitCallFlags savedImplicitCallFlags_local;
  BailOutKind bailOutKind_local;
  void *returnAddress_local;
  uint32 bailOutOffset_local;
  BailOutRecord *bailOutRecord_local;
  JavascriptCallStackLayout *layout_local;
  
  registerSaves[0x30]._3_1_ = savedImplicitCallFlags;
  registerSaves[0x30]._4_4_ = bailOutKind;
  this = Js::RecyclableObject::GetScriptContext(*(RecyclableObject **)layout);
  this_00 = Js::ScriptContext::GetThreadContext(this);
  src = ThreadContext::GetBailOutRegisterSaveSpace(this_00);
  js_memcpy_s(&result,0x188,src,0x188);
  pvVar1 = BailOutCommonNoCodeGen
                     (layout,bailOutRecord,bailOutOffset,returnAddress,registerSaves[0x30]._4_4_,
                      branchValue,&result,bailOutReturnValue,argoutRestoreAddress);
  function = Js::VarTo<Js::ScriptFunction,Js::JavascriptFunction>(*(JavascriptFunction **)layout);
  ScheduleFunctionCodeGen
            (function,(ScriptFunction *)0x0,bailOutRecord,registerSaves[0x30]._4_4_,bailOutOffset,
             registerSaves[0x30]._3_1_,returnAddress);
  return pvVar1;
}

Assistant:

Js::Var
BailOutRecord::BailOutCommon(Js::JavascriptCallStackLayout * layout, BailOutRecord const * bailOutRecord,
uint32 bailOutOffset, void * returnAddress, IR::BailOutKind bailOutKind, Js::ImplicitCallFlags savedImplicitCallFlags, Js::Var branchValue, BailOutReturnValue * bailOutReturnValue, void * argoutRestoreAddress)
{
    // Do not remove the following code.
    // Need to capture the int registers on stack as threadContext->bailOutRegisterSaveSpace is allocated from ThreadAlloc and is not scanned by recycler.
    // We don't want to save float (xmm) registers as they can be huge and they cannot contain a var.
    // However, we're somewhat stuck. We need to keep the references around until we restore values, but
    // we don't have a use for them. The easiest solution is to simply pass this into the corresponding
    // parameter for BailOutcommonNoCodeGen, but that requires us to save all of the vars, not just the
    // int ones. This is ultimately significantly more predictable than attempting to manage the lifetimes
    // in some other way though. We can't just do what we were doing previously, which is saving values
    // here and not passing them into BailOutCommonNoCodeGen, because then the compiler will likely get
    // rid of the memcpy and then the dead registerSaves array, since it can figure out that there's no
    // side effect (due to the GC not being something that the optimizer can, or should, reason about).
    Js::Var registerSaves[BailOutRegisterSaveSlotCount];
    js_memcpy_s(registerSaves, sizeof(registerSaves), (Js::Var *)layout->functionObject->GetScriptContext()->GetThreadContext()->GetBailOutRegisterSaveSpace(),
        sizeof(registerSaves));

    Js::Var result = BailOutCommonNoCodeGen(layout, bailOutRecord, bailOutOffset, returnAddress, bailOutKind, branchValue, registerSaves, bailOutReturnValue, argoutRestoreAddress);
    ScheduleFunctionCodeGen(Js::VarTo<Js::ScriptFunction>(layout->functionObject), nullptr, bailOutRecord, bailOutKind, bailOutOffset, savedImplicitCallFlags, returnAddress);
    return result;
}